

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  Info *pIVar5;
  undefined1 uVar7;
  undefined1 uVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  BumpAllocator *alloc;
  undefined4 uVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  Token TVar18;
  SourceLocation SVar19;
  UnconnectedDriveDirectiveSyntax *syntax;
  bool bVar20;
  Token TVar21;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  pTVar1 = &this->currentToken;
  pIVar5 = (this->currentToken).info;
  if (pIVar5 == (Info *)0x0) {
    TVar21 = nextProcessed(this);
    this->currentToken = TVar21;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar6 = pTVar1->field_0x2;
    uVar9 = pTVar1->numFlags;
    uVar12 = pTVar1->rawLen;
    TVar21.rawLen = uVar12;
    TVar21.numFlags.raw = uVar9;
    TVar21._2_1_ = uVar6;
    TVar21.kind = uVar2;
    TVar21.info = pIVar5;
  }
  if ((ushort)(TVar21.kind - Pull0Keyword) < 2) {
    if (TVar21.info == (Info *)0x0) {
      TVar21 = nextProcessed(this);
      this->currentToken = TVar21;
    }
    uVar15 = pTVar1->field_0x2;
    NVar16.raw = (pTVar1->numFlags).raw;
    uVar17 = pTVar1->rawLen;
    pIVar5 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar15;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
    (this->lastConsumed).rawLen = uVar17;
    (this->lastConsumed).info = pIVar5;
    Token::Token(&local_48);
    TVar18 = local_48;
    pTVar1->kind = local_48.kind;
    pTVar1->field_0x2 = local_48._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
    pTVar1->rawLen = local_48.rawLen;
    (this->currentToken).info = local_48.info;
    this->unconnectedDrive = TVar21.kind;
    local_68.info = TVar21.info;
    local_48 = TVar18;
  }
  else {
    TVar21 = local_68;
  }
  local_68 = TVar21;
  bVar20 = local_68.info == (Info *)0x0;
  if (bVar20) {
    pIVar5 = (this->currentToken).info;
    if (pIVar5 == (Info *)0x0) {
      local_48 = nextProcessed(this);
      this->currentToken = local_48;
    }
    else {
      uVar3 = pTVar1->kind;
      uVar7 = pTVar1->field_0x2;
      uVar10 = pTVar1->numFlags;
      uVar13 = pTVar1->rawLen;
      local_48.rawLen = uVar13;
      local_48.numFlags.raw = uVar10;
      local_48._2_1_ = uVar7;
      local_48.kind = uVar3;
      local_48.info = pIVar5;
    }
    SVar19 = Token::location(&local_48);
    Diagnostics::add(this->diagnostics,(DiagCode)0x30004,SVar19);
    alloc = this->alloc;
    pIVar5 = (this->currentToken).info;
    if (pIVar5 == (Info *)0x0) {
      local_48 = nextProcessed(this);
      this->currentToken = local_48;
    }
    else {
      uVar4 = pTVar1->kind;
      uVar8 = pTVar1->field_0x2;
      uVar11 = pTVar1->numFlags;
      uVar14 = pTVar1->rawLen;
      local_48.rawLen = uVar14;
      local_48.numFlags.raw = uVar11;
      local_48._2_1_ = uVar8;
      local_48.kind = uVar4;
      local_48.info = pIVar5;
    }
    SVar19 = Token::location(&local_48);
    local_68 = Token::createMissing(alloc,Pull0Keyword,SVar19);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        addDiag(diag::ExpectedDriveStrength, peek().location());
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, peek().location());
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}